

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O2

reentrant_put_transaction<void> *
density_tests::detail::
PutTestObject<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>,_2048UL,_2048UL>
::reentrant_put(reentrant_put_transaction<void> *__return_storage_ptr__,
               conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
               *i_queue,EasyRandom *param_2)

{
  conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
  *pcVar1;
  undefined8 uVar2;
  uintptr_t uVar3;
  ulong uVar4;
  reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> transaction;
  
  uVar4 = (ulong)&stack0xffffffffffffffe0 & 0xfffffffffffff800;
  *(undefined8 *)(uVar4 - 0x1808) = 0x11646ab;
  TestObject<2048UL,_2048UL>::TestObject((TestObject<2048UL,_2048UL> *)(uVar4 - 0x1000));
  *(undefined8 *)(uVar4 - 0x1808) = 0x11646be;
  density::
  sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::start_reentrant_push<density_tests::TestObject<2048ul,2048ul>>
            ((reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> *)
             (uVar4 - 0x1020),
             (sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<256ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)1,density::default_busy_wait>
              *)i_queue,(TestObject<2048UL,_2048UL> *)(uVar4 - 0x1000));
  *(undefined8 *)(uVar4 - 0x1030) = *(undefined8 *)(uVar4 - 0x1010);
  uVar2 = *(undefined8 *)(uVar4 - 0x1018);
  *(LfQueueControl **)(uVar4 - 0x1040) =
       (((reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> *)(uVar4 - 0x1020))
       ->m_put).m_control_block;
  *(undefined8 *)(uVar4 - 0x1038) = uVar2;
  pcVar1 = *(conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
             **)(uVar4 - 0x1008);
  *(conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
    **)(uVar4 - 0x1028) = pcVar1;
  *(undefined8 *)(uVar4 - 0x1010) = 0;
  *(undefined8 *)(uVar4 - 0x1808) = 0x11646f3;
  density::
  sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_>::
  ~reentrant_put_transaction
            ((reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> *)
             (uVar4 - 0x1020));
  *(undefined8 *)(uVar4 - 0x1808) = 0x1164700;
  TestObject<2048UL,_2048UL>::~TestObject((TestObject<2048UL,_2048UL> *)(uVar4 - 0x1000));
  *(undefined8 *)(uVar4 - 0x1808) = 0x1164705;
  exception_checkpoint();
  (__return_storage_ptr__->m_put).m_user_storage = *(void **)(uVar4 - 0x1030);
  uVar3 = *(uintptr_t *)(uVar4 - 0x1038);
  (__return_storage_ptr__->m_put).m_control_block =
       (((reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> *)(uVar4 - 0x1040))
       ->m_put).m_control_block;
  (__return_storage_ptr__->m_put).m_next_ptr = uVar3;
  __return_storage_ptr__->m_queue = pcVar1;
  *(undefined8 *)(uVar4 - 0x1030) = 0;
  *(undefined8 *)(uVar4 - 0x1808) = 0x1164729;
  density::
  sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_>::
  ~reentrant_put_transaction
            ((reentrant_put_transaction<density_tests::TestObject<2048UL,_2048UL>_> *)
             (uVar4 - 0x1040));
  return __return_storage_ptr__;
}

Assistant:

static typename QUEUE::template reentrant_put_transaction<void>
              reentrant_put(QUEUE & i_queue, EasyRandom &)
            {
                auto transaction = i_queue.start_reentrant_push(ElementType());
                exception_checkpoint();
                return std::move(transaction);
            }